

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svm_helper.c
# Opt level: O3

void helper_vmload_x86_64(CPUX86State *env,int aflag)

{
  CPUState *cs_00;
  uint32_t uVar1;
  uint64_t uVar2;
  CPUX86State *__mptr;
  ulong uVar3;
  CPUState *cs;
  
  if ((env->hflags & 0x200000) != 0) {
    helper_vmload_x86_64_cold_1();
  }
  uVar3 = env->regs[0] & 0xffffffff;
  if (aflag == 2) {
    uVar3 = env->regs[0];
  }
  cs_00 = (CPUState *)(env[-6].mtrr_var + 4);
  svm_load_seg_cache(env,uVar3 + 0x440,4);
  svm_load_seg_cache(env,uVar3 + 0x450,5);
  uVar1 = x86_lduw_phys_x86_64(cs_00,uVar3 + 0x490);
  (env->tr).selector = uVar1;
  uVar2 = x86_ldq_phys_x86_64(cs_00,uVar3 + 0x498);
  (env->tr).base = uVar2;
  uVar1 = x86_ldl_phys_x86_64(cs_00,uVar3 + 0x494);
  (env->tr).limit = uVar1;
  uVar1 = x86_lduw_phys_x86_64(cs_00,uVar3 + 0x492);
  (env->tr).flags = (uVar1 & 0xf00) << 0xc | (uVar1 & 0xff) << 8;
  uVar1 = x86_lduw_phys_x86_64(cs_00,uVar3 + 0x470);
  (env->ldt).selector = uVar1;
  uVar2 = x86_ldq_phys_x86_64(cs_00,uVar3 + 0x478);
  (env->ldt).base = uVar2;
  uVar1 = x86_ldl_phys_x86_64(cs_00,uVar3 + 0x474);
  (env->ldt).limit = uVar1;
  uVar1 = x86_lduw_phys_x86_64(cs_00,uVar3 + 0x472);
  (env->ldt).flags = (uVar1 & 0xf00) << 0xc | (uVar1 & 0xff) << 8;
  uVar2 = x86_ldq_phys_x86_64(cs_00,uVar3 + 0x620);
  env->kernelgsbase = uVar2;
  uVar2 = x86_ldq_phys_x86_64(cs_00,uVar3 + 0x608);
  env->lstar = uVar2;
  uVar2 = x86_ldq_phys_x86_64(cs_00,uVar3 + 0x610);
  env->cstar = uVar2;
  uVar2 = x86_ldq_phys_x86_64(cs_00,uVar3 + 0x618);
  env->fmask = uVar2;
  uVar2 = x86_ldq_phys_x86_64(cs_00,uVar3 + 0x600);
  env->star = uVar2;
  uVar2 = x86_ldq_phys_x86_64(cs_00,uVar3 + 0x628);
  env->sysenter_cs = (uint32_t)uVar2;
  uVar2 = x86_ldq_phys_x86_64(cs_00,uVar3 + 0x630);
  env->sysenter_esp = uVar2;
  uVar2 = x86_ldq_phys_x86_64(cs_00,uVar3 + 0x638);
  env->sysenter_eip = uVar2;
  return;
}

Assistant:

void helper_vmload(CPUX86State *env, int aflag)
{
    CPUState *cs = env_cpu(env);
    target_ulong addr;

    cpu_svm_check_intercept_param(env, SVM_EXIT_VMLOAD, 0, GETPC());

    if (aflag == 2) {
        addr = env->regs[R_EAX];
    } else {
        addr = (uint32_t)env->regs[R_EAX];
    }

    // qemu_log_mask(CPU_LOG_TB_IN_ASM, "vmload! " TARGET_FMT_lx
    //               "\nFS: %016" PRIx64 " | " TARGET_FMT_lx "\n",
    //               addr, x86_ldq_phys(cs, addr + offsetof(struct vmcb,
    //                                                       save.fs.base)),
    //               env->segs[R_FS].base);

    svm_load_seg_cache(env, addr + offsetof(struct vmcb, save.fs), R_FS);
    svm_load_seg_cache(env, addr + offsetof(struct vmcb, save.gs), R_GS);
    svm_load_seg(env, addr + offsetof(struct vmcb, save.tr), &env->tr);
    svm_load_seg(env, addr + offsetof(struct vmcb, save.ldtr), &env->ldt);

#ifdef TARGET_X86_64
    env->kernelgsbase = x86_ldq_phys(cs, addr + offsetof(struct vmcb,
                                                 save.kernel_gs_base));
    env->lstar = x86_ldq_phys(cs, addr + offsetof(struct vmcb, save.lstar));
    env->cstar = x86_ldq_phys(cs, addr + offsetof(struct vmcb, save.cstar));
    env->fmask = x86_ldq_phys(cs, addr + offsetof(struct vmcb, save.sfmask));
#endif
    env->star = x86_ldq_phys(cs, addr + offsetof(struct vmcb, save.star));
    env->sysenter_cs = x86_ldq_phys(cs,
                                addr + offsetof(struct vmcb, save.sysenter_cs));
    env->sysenter_esp = x86_ldq_phys(cs, addr + offsetof(struct vmcb,
                                                 save.sysenter_esp));
    env->sysenter_eip = x86_ldq_phys(cs, addr + offsetof(struct vmcb,
                                                 save.sysenter_eip));
}